

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O1

CQuad * __thiscall CEditor::GetSelectedQuad(CEditor *this)

{
  int iVar1;
  CLayer *pCVar2;
  int in_ESI;
  
  pCVar2 = GetSelectedLayer(this,in_ESI);
  if ((pCVar2 == (CLayer *)0x0) || (pCVar2->m_Type != 3)) {
    pCVar2 = (CLayer *)0x0;
  }
  if (pCVar2 != (CLayer *)0x0) {
    iVar1 = this->m_SelectedQuad;
    if ((-1 < (long)iVar1) && (iVar1 < *(int *)(pCVar2[1].m_aName + 4))) {
      return (CQuad *)((long)&(pCVar2[1].m_pEditor)->super_IEditor + (long)iVar1 * 0x98);
    }
  }
  return (CQuad *)0x0;
}

Assistant:

CQuad *CEditor::GetSelectedQuad()
{
	CLayerQuads *ql = (CLayerQuads *)GetSelectedLayerType(0, LAYERTYPE_QUADS);
	if(!ql)
		return 0;
	if(m_SelectedQuad >= 0 && m_SelectedQuad < ql->m_lQuads.size())
		return &ql->m_lQuads[m_SelectedQuad];
	return 0;
}